

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O1

char * ps_astar_hyp(ps_astar_t *nbest,ps_latpath_t *path)

{
  ps_latpath_s **pppVar1;
  ps_search_t *ppVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  glist_t pgVar7;
  size_t elem_size;
  char *__dest;
  char *__s;
  ps_latpath_s *ppVar8;
  
  ppVar2 = nbest->dag->search;
  elem_size = 0;
  ppVar8 = path;
  if (path != (ps_latpath_t *)0x0) {
    do {
      iVar3 = dict_real_word(ppVar2->dict,ppVar8->node->basewid);
      if (iVar3 != 0) {
        lVar4 = (long)ppVar8->node->basewid;
        if (lVar4 < 0) {
          pcVar6 = (char *)0x0;
        }
        else {
          pcVar6 = ppVar2->dict->word[lVar4].word;
        }
        if (pcVar6 != (char *)0x0) {
          sVar5 = strlen(pcVar6);
          elem_size = elem_size + sVar5 + 1;
        }
      }
      pppVar1 = &ppVar8->parent;
      ppVar8 = *pppVar1;
    } while (*pppVar1 != (ps_latpath_s *)0x0);
  }
  if (elem_size == 0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = (char *)__ckd_calloc__(1,elem_size,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                    ,0x727);
    if (path != (ps_latpath_t *)0x0) {
      __dest = pcVar6 + (elem_size - 1);
      do {
        iVar3 = dict_real_word(ppVar2->dict,path->node->basewid);
        if (iVar3 != 0) {
          lVar4 = (long)path->node->basewid;
          if (lVar4 < 0) {
            __s = (char *)0x0;
          }
          else {
            __s = ppVar2->dict->word[lVar4].word;
          }
          if (__s != (char *)0x0) {
            sVar5 = strlen(__s);
            __dest = __dest + -sVar5;
            memcpy(__dest,__s,sVar5);
            if (pcVar6 < __dest) {
              __dest[-1] = ' ';
              __dest = __dest + -1;
            }
          }
        }
        path = path->parent;
      } while (path != (ps_latpath_s *)0x0);
    }
    pgVar7 = glist_add_ptr(nbest->hyps,pcVar6);
    nbest->hyps = pgVar7;
  }
  return pcVar6;
}

Assistant:

char const *
ps_astar_hyp(ps_astar_t *nbest, ps_latpath_t *path)
{
    ps_search_t *search;
    ps_latpath_t *p;
    size_t len;
    char *c;
    char *hyp;

    search = nbest->dag->search;

    /* Backtrace once to get hypothesis length. */
    len = 0;
    for (p = path; p; p = p->parent) {
        if (dict_real_word(ps_search_dict(search), p->node->basewid)) {
    	    char *wstr = dict_wordstr(ps_search_dict(search), p->node->basewid);
    	    if (wstr != NULL)
    	        len += strlen(wstr) + 1;
        }
    }

    if (len == 0) {
	return NULL;
    }

    /* Backtrace again to construct hypothesis string. */
    hyp = ckd_calloc(1, len);
    c = hyp + len - 1;
    for (p = path; p; p = p->parent) {
        if (dict_real_word(ps_search_dict(search), p->node->basewid)) {
    	    char *wstr = dict_wordstr(ps_search_dict(search), p->node->basewid);
    	    if (wstr != NULL) {
	        len = strlen(wstr);
    		c -= len;
        	memcpy(c, wstr, len);
    		if (c > hyp) {
            	    --c;
        	    *c = ' ';
    		}
    	    }
        }
    }

    nbest->hyps = glist_add_ptr(nbest->hyps, hyp);
    return hyp;
}